

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::RPCCall::Deserialize(RPCCall *this,Parser *parser,RPCCall *call)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ushort uVar3;
  ulong uVar4;
  RPCCall *pRVar5;
  const_iterator cVar6;
  StructDef *pSVar7;
  Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *attrs;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *documentation;
  _Rb_tree_header *p_Var8;
  key_type local_50;
  
  if (*(ushort *)(call + -(long)*(int *)call) < 5) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(call + (4 - (long)*(int *)call));
  }
  uVar4 = (ulong)uVar3;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,call + *(uint *)(call + uVar4) + uVar4 + 4,
             call + (ulong)*(uint *)(call + *(uint *)(call + uVar4) + uVar4) +
                    *(uint *)(call + uVar4) + uVar4 + 4);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (*(ushort *)(call + -(long)*(int *)call) < 0xb) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(ushort *)(call + (10 - (long)*(int *)call));
  }
  if (uVar3 == 0) {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)0x0;
  }
  else {
    attrs = (Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int> *)
            (call + (ulong)*(uint *)(call + uVar3) + (ulong)uVar3);
  }
  bVar2 = DeserializeAttributesCommon(&(this->super_Definition).attributes,parser,attrs);
  if (bVar2) {
    if (*(ushort *)(call + -(long)*(int *)call) < 0xd) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(call + (0xc - (long)*(int *)call));
    }
    if (uVar3 == 0) {
      documentation = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
    }
    else {
      documentation =
           (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
           (call + (ulong)*(uint *)(call + uVar3) + (ulong)uVar3);
    }
    anon_unknown_0::DeserializeDoc(&(this->super_Definition).doc_comment,documentation);
    if (*(ushort *)(call + -(long)*(int *)call) < 7) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(call + (6 - (long)*(int *)call));
    }
    if (uVar3 == 0) {
      pRVar5 = (RPCCall *)0x0;
    }
    else {
      pRVar5 = call + (ulong)*(uint *)(call + uVar3) + (ulong)uVar3;
    }
    if (*(ushort *)(pRVar5 + -(long)*(int *)pRVar5) < 5) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(pRVar5 + (4 - (long)*(int *)pRVar5));
    }
    uVar4 = (ulong)uVar3;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pRVar5 + *(uint *)(pRVar5 + uVar4) + uVar4 + 4,
               pRVar5 + (ulong)*(uint *)(pRVar5 + *(uint *)(pRVar5 + uVar4) + uVar4) +
                        *(uint *)(pRVar5 + uVar4) + uVar4 + 4);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                    *)&parser->structs_,&local_50);
    p_Var8 = &(parser->structs_).dict._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)cVar6._M_node == p_Var8) {
      pSVar7 = (StructDef *)0x0;
    }
    else {
      pSVar7 = *(StructDef **)(cVar6._M_node + 2);
    }
    this->request = pSVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (*(ushort *)(call + -(long)*(int *)call) < 9) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(call + (8 - (long)*(int *)call));
    }
    if (uVar3 == 0) {
      pRVar5 = (RPCCall *)0x0;
    }
    else {
      pRVar5 = call + (ulong)*(uint *)(call + uVar3) + (ulong)uVar3;
    }
    if (*(ushort *)(pRVar5 + -(long)*(int *)pRVar5) < 5) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(pRVar5 + (4 - (long)*(int *)pRVar5));
    }
    uVar4 = (ulong)uVar3;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,pRVar5 + *(uint *)(pRVar5 + uVar4) + uVar4 + 4,
               pRVar5 + (ulong)*(uint *)(pRVar5 + *(uint *)(pRVar5 + uVar4) + uVar4) +
                        *(uint *)(pRVar5 + uVar4) + uVar4 + 4);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                    *)&parser->structs_,&local_50);
    if ((_Rb_tree_header *)cVar6._M_node == p_Var8) {
      pSVar7 = (StructDef *)0x0;
    }
    else {
      pSVar7 = *(StructDef **)(cVar6._M_node + 2);
    }
    this->response = pSVar7;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar2 = this->response != (StructDef *)0x0 && this->request != (StructDef *)0x0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool RPCCall::Deserialize(Parser &parser, const reflection::RPCCall *call) {
  name = call->name()->str();
  if (!DeserializeAttributes(parser, call->attributes())) return false;
  DeserializeDoc(doc_comment, call->documentation());
  request = parser.structs_.Lookup(call->request()->name()->str());
  response = parser.structs_.Lookup(call->response()->name()->str());
  if (!request || !response) { return false; }
  return true;
}